

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O2

string * __thiscall
pfederc::MatchExpr::toString_abi_cxx11_(string *__return_storage_ptr__,MatchExpr *this)

{
  pointer ptVar1;
  Token *pTVar2;
  pointer ppTVar3;
  bool bVar4;
  char cVar5;
  tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
  *matchcase;
  pointer ptVar6;
  Token **var;
  pointer ppTVar7;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"match ",(allocator<char> *)&local_50);
  (*((this->expr)._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
     _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
     super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->_vptr_Expr[2])(&local_50);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_50);
  cVar5 = (char)__return_storage_ptr__;
  std::__cxx11::string::push_back(cVar5);
  ptVar1 = (this->cases).
           super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ptVar6 = (this->cases).
                super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ptVar6 != ptVar1; ptVar6 = ptVar6 + 1) {
    pTVar2 = (ptVar6->
             super__Tuple_impl<0UL,_const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
             ).super__Head_base<0UL,_const_pfederc::Token_*,_false>._M_head_impl;
    (*pTVar2->_vptr_Token[2])(&local_50,pTVar2,(this->super_Expr).lexer);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    if ((ptVar6->
        super__Tuple_impl<0UL,_const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
        ).
        super__Tuple_impl<1UL,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
        .
        super__Head_base<1UL,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_false>
        ._M_head_impl.
        super__Vector_base<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (ptVar6->
        super__Tuple_impl<0UL,_const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
        ).
        super__Tuple_impl<1UL,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
        .
        super__Head_base<1UL,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_false>
        ._M_head_impl.
        super__Vector_base<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::__cxx11::string::push_back(cVar5);
      ppTVar3 = (ptVar6->
                super__Tuple_impl<0UL,_const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
                ).
                super__Tuple_impl<1UL,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
                .
                super__Head_base<1UL,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_false>
                ._M_head_impl.
                super__Vector_base<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      bVar4 = true;
      for (ppTVar7 = (ptVar6->
                     super__Tuple_impl<0UL,_const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
                     ).
                     super__Tuple_impl<1UL,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
                     .
                     super__Head_base<1UL,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_false>
                     ._M_head_impl.
                     super__Vector_base<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppTVar7 != ppTVar3;
          ppTVar7 = ppTVar7 + 1) {
        if (!bVar4) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        (*(*ppTVar7)->_vptr_Token[2])(&local_50,*ppTVar7,(this->super_Expr).lexer);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_50);
        bVar4 = false;
      }
      std::__cxx11::string::push_back(cVar5);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    BodyExpr::toString_abi_cxx11_
              (&local_50,
               (BodyExpr *)
               (ptVar6->
               super__Tuple_impl<0UL,_const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
               ).
               super__Tuple_impl<1UL,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
               .
               super__Tuple_impl<2UL,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
               .
               super__Head_base<2UL,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>,_false>
               ._M_head_impl._M_t.
               super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((this->anyCase)._M_t.
      super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>._M_t.
      super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
      super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl != (BodyExpr *)0x0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    BodyExpr::toString_abi_cxx11_
              (&local_50,
               (this->anyCase)._M_t.
               super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>.
               _M_t.
               super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
               super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::push_back(cVar5);
  return __return_storage_ptr__;
}

Assistant:

std::string MatchExpr::toString() const noexcept {
  std::string result = "match ";
  result += getExpression().toString();
  result += '\n';
  for (auto &matchcase : cases) {
    result += std::get<0>(matchcase)->toString(getLexer());
    if (!std::get<1>(matchcase).empty()) {
      result += '(';
      bool first = true;
      for (auto &var : std::get<1>(matchcase)) {
        if (!first)
          result += ", ";
        else
          first = false;

        result += var->toString(getLexer());
      }
      result += ')';
    }

    result += " => ";

    result += std::get<2>(matchcase)->toString();
    result += ";\n";
  }

  if (anyCase) {
    result += "_ => ";
    result += anyCase->toString();
    result += ";\n";
  }

  result += ';';

  return result;
}